

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::AOIntegrator::Li
          (AOIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,SamplerHandle *sampler
          ,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  PrimitiveHandle *this_00;
  Float tMax;
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ushort uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined1 auVar9 [56];
  bool bVar10;
  int iVar11;
  HaltonSampler *this_01;
  DebugMLTSampler *this_02;
  undefined1 auVar14 [16];
  long in_FS_OFFSET;
  undefined1 in_ZmmResult [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  float fVar21;
  float fVar22;
  undefined1 auVar24 [16];
  undefined8 uVar23;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar35 [56];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar34 [64];
  float fVar36;
  undefined8 uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [56];
  undefined1 auVar43 [56];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  SampledSpectrum SVar52;
  anon_class_8_1_5ef94505_conflict samp;
  Ray r;
  BSDF bsdf;
  Tuple3<pbrt::Vector3,_float> local_388;
  DispatchSplit<6> local_379;
  undefined1 local_378 [16];
  float local_364;
  SampledWavelengths *local_360;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_358;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_350;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined8 *local_2f0;
  uchar *local_2e8;
  ScratchBuffer *local_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  anon_struct_8_0_00000001_for___align local_2b8;
  float fStack_2b0;
  float local_2ac;
  float fStack_2a8;
  ulong uStack_2a4;
  MediumHandle local_298;
  undefined1 local_288 [84];
  float fStack_234;
  float fStack_230;
  float fStack_1f8;
  float fStack_1f4;
  Tuple3<pbrt::Vector3,_float> aTStack_1f0 [2];
  Tuple3<pbrt::Normal3,_float> TStack_1d8;
  int iStack_1cc;
  MaterialHandle local_1c8;
  LightHandle LStack_1c0;
  undefined8 local_1b8 [5];
  Float local_190;
  char local_188;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_178;
  ulong local_78;
  BSDF local_70;
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  undefined1 auVar20 [64];
  undefined1 auVar33 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 auVar41 [64];
  
  local_188 = '\0';
  this_00 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_2f0 = local_1b8;
  local_2e8 = local_178.__data + 0xd0;
  local_360 = lambda;
  local_2e0 = scratchBuffer;
  do {
    *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
    if (((this_00->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
      local_178._64_8_ = 0;
      local_178._136_8_ = 0;
      local_178._144_8_ = 0;
      local_178._152_8_ = 0;
      local_178._160_8_ = 0;
      local_178._168_8_ = 0;
      local_178._176_8_ = 0;
      local_178._184_8_ = 0;
      local_178._80_48_ = (undefined1  [48])0x0;
      local_78 = 0;
      local_178._0_64_ = in_ZmmResult;
      local_178._72_8_ = local_178._136_8_;
      local_178._128_8_ = local_178._64_8_;
      local_178._192_64_ = in_ZmmResult;
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_178.__align,this_00,&ray->super_Ray,
                 INFINITY);
    }
    if (local_188 == '\x01') {
      local_188 = '\0';
    }
    if ((char)local_78 == '\x01') {
      local_288._0_8_ = local_178.__align;
      local_288._8_8_ = local_178._8_8_;
      local_288._16_8_ = local_178._16_8_;
      local_288._24_8_ = local_178._24_8_;
      local_288._32_8_ = local_178._32_8_;
      local_288._40_8_ = local_178._40_8_;
      local_288._48_8_ = local_178._48_8_;
      local_288._56_8_ = local_178._56_8_;
      local_288._64_8_ = local_178._64_8_;
      local_288._72_8_ = local_178._72_8_;
      in_ZmmResult._48_8_ = local_178._128_8_;
      in_ZmmResult._0_48_ = local_178._80_48_;
      in_ZmmResult._56_8_ = local_178._136_8_;
      fStack_1f8 = (float)local_178._144_4_;
      fStack_1f4 = (float)local_178._148_4_;
      aTStack_1f0[0].x = (float)local_178._152_4_;
      aTStack_1f0[0].y = (float)local_178._156_4_;
      aTStack_1f0[0].z = (float)local_178._160_4_;
      aTStack_1f0[1].x = (float)local_178._164_4_;
      aTStack_1f0[1].y = (float)local_178._168_4_;
      aTStack_1f0[1].z = (float)local_178._172_4_;
      TStack_1d8.x = (float)local_178._176_4_;
      TStack_1d8.y = (float)local_178._180_4_;
      TStack_1d8.z = (float)local_178._184_4_;
      iStack_1cc = local_178._188_4_;
      local_1c8.
      super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      .bits = (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
               )(TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                 )local_178._192_8_;
      LStack_1c0.
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               )(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                 )local_178._200_8_;
      local_2f0[4] = *(undefined8 *)(local_2e8 + 0x20);
      uVar37 = *(undefined8 *)(local_2e8 + 8);
      uVar23 = *(undefined8 *)(local_2e8 + 0x10);
      uVar8 = *(undefined8 *)(local_2e8 + 0x18);
      *local_2f0 = *(undefined8 *)local_2e8;
      local_2f0[1] = uVar37;
      local_2f0[2] = uVar23;
      local_2f0[3] = uVar8;
      local_190 = (Float)local_178._248_4_;
      local_188 = '\x01';
      local_78 = local_78 & 0xffffffffffffff00;
      unique0x10001386 = in_ZmmResult;
    }
    if ((char)local_78 == '\x01') {
      local_78 = local_78 & 0xffffffffffffff00;
    }
    uVar37 = 0;
    if (local_188 != '\x01') {
      uVar23 = 0;
      goto LAB_0041d3c8;
    }
    local_350.bits =
         (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_358.bits =
         (sampler->
         super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    SurfaceInteraction::GetBSDF
              (&local_70,(SurfaceInteraction *)local_288,ray,local_360,(CameraHandle *)&local_350,
               local_2e0,(SamplerHandle *)&local_358);
    if (((ulong)local_70.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                .bits & 0xffffffffffff) == 0) {
      if (local_188 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
      }
      iVar11 = 2;
      SurfaceInteraction::SkipIntersection((SurfaceInteraction *)local_288,ray,local_190);
    }
    else {
      fVar21 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_318._8_8_ = 0;
      local_318._0_8_ = local_288._40_8_;
      auVar14 = vmovshdup_avx(local_318);
      auVar12 = ZEXT416((uint)((float)local_288._48_4_ * -fVar21));
      auVar14 = vfnmadd132ss_fma(auVar14,auVar12,
                                 ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>
                                               .y));
      local_308 = ZEXT416((uint)local_288._48_4_);
      auVar12 = vfnmsub213ss_fma(ZEXT416((uint)fVar21),local_308,auVar12);
      auVar14 = vfnmadd132ss_fma(local_318,ZEXT416((uint)(auVar14._0_4_ + auVar12._0_4_)),
                                 ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>
                                               .x));
      local_328._0_4_ = auVar14._0_4_;
      if (auVar14._0_4_ < 0.0) {
        local_318._0_8_ = local_288._40_8_ ^ 0x8000000080000000;
        local_318._8_4_ = 0x80000000;
        local_318._12_4_ = 0x80000000;
      }
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fStack_234 * fStack_234)),
                                ZEXT416((uint)local_288._80_4_),ZEXT416((uint)local_288._80_4_));
      auVar14 = vfmadd213ss_fma(ZEXT416((uint)fStack_230),ZEXT416((uint)fStack_230),auVar14);
      if (auVar14._0_4_ < 0.0) {
        sqrtf(auVar14._0_4_);
      }
      local_388.x = 0.0;
      local_388.y = 0.0;
      local_388.z = 0.0;
      uVar1 = (sampler->
              super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
      uVar5 = (ushort)(uVar1 >> 0x30);
      if (uVar1 >> 0x30 < 5) {
        this_01 = (HaltonSampler *)(uVar1 & 0xffffffffffff);
        if (uVar5 < 3) {
          if (uVar5 == 2) {
            auVar25._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_01);
            auVar25._8_56_ = extraout_var_01;
            auVar14 = auVar25._0_16_;
          }
          else {
            auVar29._0_8_ = HaltonSampler::Get2D(this_01);
            auVar29._8_56_ = extraout_var_05;
            auVar14 = auVar29._0_16_;
          }
        }
        else if (uVar5 == 3) {
          auVar27._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_01);
          auVar27._8_56_ = extraout_var_03;
          auVar14 = auVar27._0_16_;
        }
        else {
          auVar31._0_8_ = RandomSampler::Get2D((RandomSampler *)this_01);
          auVar31._8_56_ = extraout_var_07;
          auVar14 = auVar31._0_16_;
        }
      }
      else {
        this_02 = (DebugMLTSampler *)(uVar1 & 0xffffffffffff);
        if (uVar5 < 7) {
          if (uVar5 == 6) {
            auVar26._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_02);
            auVar26._8_56_ = extraout_var_02;
            auVar14 = auVar26._0_16_;
          }
          else {
            auVar30._0_8_ = SobolSampler::Get2D((SobolSampler *)this_02);
            auVar30._8_56_ = extraout_var_06;
            auVar14 = auVar30._0_16_;
          }
        }
        else if (uVar5 == 7) {
          auVar28._0_8_ = MLTSampler::Get2D((MLTSampler *)this_02);
          auVar28._8_56_ = extraout_var_04;
          auVar14 = auVar28._0_16_;
        }
        else {
          local_378._0_4_ = DebugMLTSampler::Get1D(this_02);
          local_378._4_4_ = extraout_XMM0_Db;
          local_378._8_4_ = extraout_XMM0_Dc;
          local_378._12_4_ = extraout_XMM0_Dd;
          auVar34._0_4_ = DebugMLTSampler::Get1D(this_02);
          auVar34._4_60_ = extraout_var_00;
          auVar14 = vinsertps_avx(local_378,auVar34._0_16_,0x10);
        }
      }
      if (this->cosSample == true) {
        auVar12._0_4_ = auVar14._0_4_ + auVar14._0_4_;
        auVar12._4_4_ = auVar14._4_4_ + auVar14._4_4_;
        auVar12._8_4_ = auVar14._8_4_ + auVar14._8_4_;
        auVar12._12_4_ = auVar14._12_4_ + auVar14._12_4_;
        auVar14._8_4_ = 0xbf800000;
        auVar14._0_8_ = 0xbf800000bf800000;
        auVar14._12_4_ = 0xbf800000;
        auVar16._16_48_ = in_ZmmResult._16_48_;
        auVar12 = vaddps_avx512vl(auVar12,auVar14);
        auVar14 = vmovshdup_avx(auVar12);
        auVar6 = ZEXT812(0);
        fVar22 = auVar12._0_4_;
        fVar21 = auVar14._0_4_;
        if ((fVar22 != 0.0) || (NAN(fVar22))) {
LAB_0041cfc6:
          auVar45._8_4_ = 0x7fffffff;
          auVar45._0_8_ = 0x7fffffff7fffffff;
          auVar45._12_4_ = 0x7fffffff;
          auVar13 = vandps_avx512vl(auVar12,auVar45);
          auVar45 = vshufps_avx(auVar13,auVar13,0xf5);
          bVar10 = auVar45._0_4_ < auVar13._0_4_;
          auVar13._0_4_ = fVar22 / fVar21;
          auVar13._4_12_ = auVar12._4_12_;
          auVar12 = vfmadd132ss_fma(auVar13,SUB6416(ZEXT464(0x3fc90fdb),0),ZEXT416(0xbf490fdb));
          auVar16._0_16_ = auVar12;
          auVar15._4_60_ = auVar16._4_60_;
          auVar15._0_4_ =
               (float)((uint)bVar10 * (int)((fVar21 / fVar22) * 0.7853982) +
                      (uint)!bVar10 * auVar12._0_4_);
          local_338 = auVar15._0_16_;
          auVar18._16_48_ = auVar16._16_48_;
          auVar18._0_16_ = auVar14;
          auVar17._4_60_ = auVar18._4_60_;
          auVar17._0_4_ = (uint)bVar10 * (int)fVar22 + (uint)!bVar10 * (int)fVar21;
          local_378 = auVar17._0_16_;
          fVar21 = cosf(auVar15._0_4_);
          local_348._0_4_ = fVar21;
          fVar21 = sinf((float)local_338._0_4_);
          auVar6 = ZEXT812(0) << 0x20;
          auVar45 = vinsertps_avx(ZEXT416((uint)(local_378._0_4_ * (float)local_348._0_4_)),
                                  ZEXT416((uint)(local_378._0_4_ * fVar21)),0x10);
        }
        else {
          auVar45 = ZEXT816(0) << 0x40;
          if ((fVar21 != 0.0) || (NAN(fVar21))) goto LAB_0041cfc6;
        }
        auVar7._12_4_ = 0;
        auVar7._0_12_ = auVar6;
        auVar12 = vfnmadd213ss_fma(auVar45,auVar45,ZEXT416(0x3f800000));
        auVar14 = vmovshdup_avx(auVar45);
        auVar14 = vfnmadd213ss_fma(auVar14,auVar14,auVar12);
        auVar14 = vmaxss_avx(auVar14,auVar7 << 0x20);
        if (auVar14._0_4_ < 0.0) {
          local_378 = auVar45;
          auVar32._0_4_ = sqrtf(auVar14._0_4_);
          auVar32._4_60_ = extraout_var;
          auVar14 = auVar32._0_16_;
          auVar45 = local_378;
        }
        else {
          auVar14 = vsqrtss_avx(auVar14,auVar14);
        }
        local_388._0_8_ = vmovlps_avx(auVar45);
        local_388.z = auVar14._0_4_;
        auVar2._8_4_ = 0x7fffffff;
        auVar2._0_8_ = 0x7fffffff7fffffff;
        auVar2._12_4_ = 0x7fffffff;
        in_ZmmResult._0_16_ = vandps_avx512vl(auVar14,auVar2);
        in_ZmmResult._16_48_ = auVar16._16_48_;
        fVar21 = in_ZmmResult._0_4_ * 0.31830987;
      }
      else {
        auVar12 = vfnmadd213ss_fma(auVar14,auVar14,ZEXT416(0x3f800000));
        auVar12 = vmaxss_avx(auVar12,ZEXT816(0) << 0x40);
        local_348 = auVar14;
        if (auVar12._0_4_ < 0.0) {
          fVar21 = sqrtf(auVar12._0_4_);
        }
        else {
          auVar14 = vsqrtss_avx(auVar12,auVar12);
          fVar21 = auVar14._0_4_;
        }
        local_378._0_4_ = fVar21;
        auVar14 = vmovshdup_avx(local_348);
        local_364 = auVar14._0_4_ * 6.2831855;
        fVar21 = cosf(local_364);
        local_338 = ZEXT416((uint)(fVar21 * (float)local_378._0_4_));
        fVar21 = sinf(local_364);
        auVar14 = vinsertps_avx(local_338,ZEXT416((uint)(fVar21 * (float)local_378._0_4_)),0x10);
        local_388._0_8_ = vmovlps_avx(auVar14);
        local_388.z = (float)local_348._0_4_;
        fVar21 = 0.15915494;
      }
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        local_378._0_4_ = fVar21;
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar20._16_48_ = in_ZmmResult._16_48_;
        auVar14 = vxorps_avx512vl(local_308,auVar3);
        uVar37 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)local_328._0_4_),0xe);
        bVar10 = (bool)((byte)uVar37 & 1);
        auVar20._0_16_ = local_308;
        auVar19._4_60_ = auVar20._4_60_;
        auVar19._0_4_ = (float)((uint)bVar10 * auVar14._0_4_ + (uint)!bVar10 * local_308._0_4_);
        local_308 = auVar19._0_16_;
        auVar44._8_4_ = 0x80000000;
        auVar44._0_8_ = 0x8000000080000000;
        auVar44._12_4_ = 0x80000000;
        auVar4._8_4_ = 0x3f800000;
        auVar4._0_8_ = 0x3f8000003f800000;
        auVar4._12_4_ = 0x3f800000;
        in_ZmmResult._0_16_ = vpternlogd_avx512vl(auVar44,local_308,auVar4,0xea);
        in_ZmmResult._16_48_ = auVar20._16_48_;
        fVar22 = in_ZmmResult._0_4_;
        auVar38._0_4_ = -1.0 / (auVar19._0_4_ + fVar22);
        local_328 = vmovshdup_avx(local_318);
        fVar48 = local_318._0_4_;
        fVar21 = fVar48 * local_328._0_4_ * auVar38._0_4_;
        auVar46._0_4_ = fVar48 * fVar48 * fVar22;
        fVar49 = local_318._4_4_;
        auVar46._4_4_ = fVar49 * 0.0;
        fVar50 = local_318._8_4_;
        auVar46._8_4_ = fVar50 * 0.0;
        fVar51 = local_318._12_4_;
        auVar46._12_4_ = fVar51 * 0.0;
        auVar38._4_4_ = auVar38._0_4_;
        auVar38._8_4_ = auVar38._0_4_;
        auVar38._12_4_ = auVar38._0_4_;
        auVar47._8_4_ = 0x3f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._12_4_ = 0x3f800000;
        auVar14 = vunpcklps_avx(auVar47,in_ZmmResult._0_16_);
        auVar13 = vfmadd231ps_fma(auVar14,auVar46,auVar38);
        auVar39._8_8_ = 0;
        auVar39._0_4_ = local_388.x;
        auVar39._4_4_ = local_388.y;
        fVar36 = local_388.x;
        auVar14 = vinsertps_avx(ZEXT416((uint)fVar21),ZEXT416((uint)(fVar22 * fVar21)),0x1c);
        auVar45 = vshufps_avx(auVar39,auVar39,0xe1);
        auVar40._0_4_ = fVar48 * fVar36;
        auVar40._4_4_ = fVar49 * local_388.y;
        auVar40._8_4_ = fVar50 * 0.0;
        auVar40._12_4_ = fVar51 * 0.0;
        auVar12 = vmovshdup_avx(auVar40);
        auVar24._0_4_ =
             auVar14._0_4_ * auVar45._0_4_ + auVar13._0_4_ * fVar36 + fVar48 * local_388.z;
        auVar24._4_4_ =
             auVar14._4_4_ * auVar45._4_4_ + auVar13._4_4_ * local_388.y + fVar49 * local_388.z;
        auVar24._8_4_ = auVar14._8_4_ * auVar45._8_4_ + auVar13._8_4_ * 0.0 + fVar50 * local_388.z;
        auVar24._12_4_ =
             auVar14._12_4_ * auVar45._12_4_ + auVar13._12_4_ * 0.0 + fVar51 * local_388.z;
        local_388._0_8_ = vmovlps_avx(auVar24);
        local_388.z = (fVar48 * -fVar22 * fVar36 - auVar12._0_4_) + auVar19._0_4_ * local_388.z;
        Interaction::SpawnRay
                  ((RayDifferential *)&local_178.__align,(Interaction *)local_288,
                   (Vector3f *)&local_388);
        auVar9 = local_178._8_56_;
        auVar42 = ZEXT856((ulong)local_178._20_8_);
        auVar43 = ZEXT856((ulong)local_178._20_8_);
        fStack_2a8 = local_178._16_4_;
        uStack_2a4 = local_178._20_8_;
        local_2b8 = local_178.__align;
        fStack_2b0 = local_178._8_4_;
        local_2ac = local_178._12_4_;
        local_298.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                   )local_178._32_8_;
        tMax = this->maxDist;
        auVar35 = (undefined1  [56])0x0;
        *(long *)(in_FS_OFFSET + -0x378) = *(long *)(in_FS_OFFSET + -0x378) + 1;
        local_178._8_56_ = auVar9;
        if (((this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate.
             super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
             .bits & 0xffffffffffff) != 0) {
          auVar35 = (undefined1  [56])0x0;
          auVar43 = auVar42;
          bVar10 = PrimitiveHandle::IntersectP(this_00,(Ray *)&local_2b8,tMax);
          iVar11 = 0;
          if (bVar10) goto LAB_0041d372;
        }
        local_178.__align =
             (anon_struct_8_0_00000001_for___align)
             (this->illuminant).
             super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             .bits;
        SVar52 = detail::DispatchSplit<6>::operator()(&local_379,local_360,&local_178);
        auVar41._0_8_ = SVar52.values.values._8_8_;
        auVar41._8_56_ = auVar43;
        auVar33._0_8_ = SVar52.values.values._0_8_;
        auVar33._8_56_ = auVar35;
        auVar12 = ZEXT416((uint)(local_308._0_4_ * local_388.z));
        auVar14 = vfmadd132ss_fma(local_328,auVar12,ZEXT416((uint)local_388.y));
        auVar12 = vfmsub213ss_fma(ZEXT416((uint)local_388.z),local_308,auVar12);
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ + auVar12._0_4_)),local_318,
                                  ZEXT416((uint)local_388.x));
        fVar21 = auVar14._0_4_ / ((float)local_378._0_4_ * 3.1415927);
        auVar14 = vmovlhps_avx(auVar33._0_16_,auVar41._0_16_);
        local_2d8._0_4_ = fVar21 * auVar14._0_4_;
        local_2d8._4_4_ = fVar21 * auVar14._4_4_;
        local_2d8._8_4_ = fVar21 * auVar14._8_4_;
        local_2d8._12_4_ = fVar21 * auVar14._12_4_;
        local_2c8 = vshufpd_avx(local_2d8,local_2d8,1);
        iVar11 = 1;
      }
      else {
        iVar11 = 1;
        local_2d8 = ZEXT416(0) << 0x20;
        local_2c8 = local_2d8;
      }
    }
LAB_0041d372:
  } while (iVar11 == 2);
  uVar23 = 0;
  uVar37 = 0;
  if (iVar11 != 0) {
    uVar23 = local_2d8._0_8_;
    uVar37 = local_2c8._0_8_;
  }
LAB_0041d3c8:
  SVar52.values.values[2] = (float)(int)uVar37;
  SVar52.values.values[3] = (float)(int)((ulong)uVar37 >> 0x20);
  SVar52.values.values[0] = (float)(int)uVar23;
  SVar52.values.values[1] = (float)(int)((ulong)uVar23 >> 0x20);
  return (SampledSpectrum)SVar52.values.values;
}

Assistant:

SampledSpectrum AOIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f);

    // Intersect _ray_ with scene and store intersection in _isect_
    pstd::optional<ShapeIntersection> si;
retry:
    si = Intersect(ray);
    if (si) {
        SurfaceInteraction &isect = si->intr;
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            goto retry;
        }

        // Compute coordinate frame based on true geometry, not shading
        // geometry.
        Normal3f n = FaceForward(isect.n, -ray.d);
        Vector3f s = Normalize(isect.dpdu);
        Vector3f t = Cross(isect.n, s);

        Vector3f wi;
        Float pdf;
        Point2f u = sampler.Get2D();
        if (cosSample) {
            wi = SampleCosineHemisphere(u);
            pdf = CosineHemispherePDF(std::abs(wi.z));
        } else {
            wi = SampleUniformHemisphere(u);
            pdf = UniformHemispherePDF();
        }
        if (pdf == 0)
            return SampledSpectrum(0.);

        Frame f = Frame::FromZ(n);
        wi = f.FromLocal(wi);

        // Divide by pi so that fully visible is one.
        Ray r = isect.SpawnRay(wi);
        if (!IntersectP(r, maxDist))
            return illuminant.Sample(lambda) * SampledSpectrum(Dot(wi, n) / (Pi * pdf));
    }
    return SampledSpectrum(0.);
}